

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O0

void __thiscall
gdscpp::setSTR(gdscpp *this,vector<gdsSTR,_std::allocator<gdsSTR>_> *target_structure)

{
  vector<gdsSTR,_std::allocator<gdsSTR>_> local_30;
  vector<gdsSTR,_std::allocator<gdsSTR>_> *local_18;
  vector<gdsSTR,_std::allocator<gdsSTR>_> *target_structure_local;
  gdscpp *this_local;
  
  local_18 = target_structure;
  target_structure_local = (vector<gdsSTR,_std::allocator<gdsSTR>_> *)this;
  std::vector<gdsSTR,_std::allocator<gdsSTR>_>::vector(&local_30,target_structure);
  push_back_STR(this,&local_30);
  std::vector<gdsSTR,_std::allocator<gdsSTR>_>::~vector(&local_30);
  return;
}

Assistant:

void gdscpp::setSTR(vector<gdsSTR> target_structure)
{
  this->push_back_STR(target_structure);
}